

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O1

void EnumStr(node *p,array *List)

{
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  
  if (p != (node *)0x0) {
    sVar3 = StrTab_Size((strtab *)(*p->VMT + 0x130));
    List->_Begin = (char *)0x0;
    List->_Used = 0;
    ArrayResize(List,sVar3 * 8,0);
    if (sVar3 != 0) {
      pcVar2 = List->_Begin;
      lVar4 = 0x100;
      do {
        *(long *)(pcVar2 + lVar4 * 8 + -0x800) = lVar4;
        lVar1 = lVar4 - sVar3;
        lVar4 = lVar4 + 1;
      } while (lVar1 != 0xff);
    }
    return;
  }
  __assert_fail("(const void*)(p)!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/parser/parser2.c"
                ,0x474,"void EnumStr(node *, array *)");
}

Assistant:

static void EnumStr(node *p,array* List)
{
    dataid Id,*i;
    size_t StrSize = StrTab_Size(&Parser_Context(p)->StrTab);

    ArrayInit(List);
    ArrayResize(List,StrSize*sizeof(dataid),0);
    i = ARRAYBEGIN(*List,dataid);
    for (Id = 0;Id < StrSize;++Id,++i)
        *i = Id+LANG_STRINGS_OFFSET;
}